

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

int wait_for_socket_connection(SOCKET_IO_INSTANCE *socket_io_instance)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  LOGGER_LOG p_Var4;
  bool local_e1;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  socklen_t len;
  int so_error;
  LOGGER_LOG l;
  fd_set *__arr;
  undefined1 auStack_b0 [4];
  uint __i;
  timeval tv;
  fd_set fdset;
  int select_errno;
  int retval;
  int err;
  int result;
  SOCKET_IO_INSTANCE *socket_io_instance_local;
  
  fdset.fds_bits[0xf]._0_4_ = 0;
  l = (LOGGER_LOG)&tv.tv_usec;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    *(__suseconds_t *)((long)l + (ulong)__arr._4_4_ * 8) = 0;
  }
  lVar2 = (long)(socket_io_instance->socket / 0x40);
  fdset.fds_bits[lVar2 + -1] =
       1L << ((byte)((long)socket_io_instance->socket % 0x40) & 0x3f) | fdset.fds_bits[lVar2 + -1];
  _auStack_b0 = 10;
  tv.tv_sec = 0;
  do {
    iVar1 = select(socket_io_instance->socket + 1,(fd_set *)0x0,(fd_set *)&tv.tv_usec,(fd_set *)0x0,
                   (timeval *)auStack_b0);
    if (iVar1 < 0) {
      piVar3 = __errno_location();
      fdset.fds_bits[0xf]._0_4_ = *piVar3;
    }
    local_e1 = iVar1 < 0 && (int)fdset.fds_bits[0xf] == 4;
  } while (local_e1);
  if (iVar1 == 1) {
    l_1._4_4_ = 0;
    l_1._0_4_ = 4;
    iVar1 = getsockopt(socket_io_instance->socket,1,4,(void *)((long)&l_1 + 4),(socklen_t *)&l_1);
    if (iVar1 == 0) {
      if (l_1._4_4_ == 0) {
        retval = 0;
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/socketio_berkeley.c"
                    ,"wait_for_socket_connection",699,1,"Failure: connect failure %d.",l_1._4_4_);
        }
        retval = 700;
      }
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        piVar3 = __errno_location();
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/socketio_berkeley.c"
                  ,"wait_for_socket_connection",0x2b5,1,"Failure: getsockopt failure %d.",*piVar3);
      }
      retval = 0x2b6;
    }
  }
  else {
    _len = xlogging_get_log_function();
    if (_len != (LOGGER_LOG)0x0) {
      (*_len)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/socketio_berkeley.c"
              ,"wait_for_socket_connection",0x2ab,1,"Failure: select failure.");
    }
    retval = 0x2ac;
  }
  if (retval != 0) {
    if (-1 < socket_io_instance->socket) {
      close(socket_io_instance->socket);
    }
    socket_io_instance->socket = -1;
  }
  return retval;
}

Assistant:

static int wait_for_socket_connection(SOCKET_IO_INSTANCE* socket_io_instance)
{
    int result;
    int err;
    int retval;
    int select_errno = 0;

    fd_set fdset;
    struct timeval tv;

    FD_ZERO(&fdset);
    FD_SET(socket_io_instance->socket, &fdset);
    tv.tv_sec = CONNECT_TIMEOUT;
    tv.tv_usec = 0;

    do
    {
        retval = select(socket_io_instance->socket + 1, NULL, &fdset, NULL, &tv);

        if (retval < 0)
        {
            select_errno = errno;
        }
    } while (retval < 0 && select_errno == EINTR);

    if (retval != 1)
    {
        LogError("Failure: select failure.");
        result = MU_FAILURE;
    }
    else
    {
        int so_error = 0;
        socklen_t len = sizeof(so_error);
        err = getsockopt(socket_io_instance->socket, SOL_SOCKET, SO_ERROR, &so_error, &len);
        if (err != 0)
        {
            LogError("Failure: getsockopt failure %d.", errno);
            result = MU_FAILURE;
        }
        else if (so_error != 0)
        {
            err = so_error;
            LogError("Failure: connect failure %d.", so_error);
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    if (result != 0)
    {
        if (socket_io_instance->socket >= SOCKET_SUCCESS)
        {
            close(socket_io_instance->socket);
        }
        socket_io_instance->socket = INVALID_SOCKET;
    }

    return result;
}